

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O1

ValueType * __thiscall
nanovdb::
ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
::getValue(ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
           *this,CoordType *ijk)

{
  ValueType *pVVar1;
  ValueType *pVVar2;
  ValueType *pVVar3;
  uint uVar4;
  
  uVar4 = (this->mKey).mVec[2] ^ ijk->mVec[2] |
          (this->mKey).mVec[1] ^ ijk->mVec[1] | (this->mKey).mVec[0] ^ ijk->mVec[0];
  if (this->mNode[0] != (void *)0x0) {
    if (uVar4 < 8) {
      return (ValueType *)
             ((long)this->mNode[0] +
             (ulong)(ijk->mVec[2] & 7U | (ijk->mVec[0] & 7U) * 0x40 + (ijk->mVec[1] & 7U) * 8) * 4 +
             0x40);
    }
    this->mNode[0] = (void *)0x0;
  }
  if (this->mNode[1] != (void *)0x0) {
    if (uVar4 < 0x80) {
      pVVar1 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
               getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                         ((InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>
                           *)this->mNode[1],ijk,this);
      return pVVar1;
    }
    this->mNode[1] = (void *)0x0;
  }
  if (this->mNode[2] != (void *)0x0) {
    if (uVar4 < 0x1000) {
      pVVar2 = InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
               ::
               getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                         ((InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
                           *)this->mNode[2],ijk,this);
      return pVVar2;
    }
    this->mNode[2] = (void *)0x0;
  }
  pVVar3 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
           ::
           getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                     ((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                       *)this->mNode[3],ijk,this);
  return pVVar3;
}

Assistant:

__hostdev__ const ValueType& getValue(const CoordType& ijk) const
    {
#ifdef USE_SINGLE_ACCESSOR_KEY
        const CoordValueType dirty = this->computeDirty(ijk);
#else
        auto&& dirty = ijk;
#endif
        if (this->isCached<NodeT0>(dirty)) {
            return ((NodeT0*)mNode[0])->getValue(ijk);
        } else if (this->isCached<NodeT1>(dirty)) {
            return ((NodeT1*)mNode[1])->getValueAndCache(ijk, *this);
        } else if (this->isCached<NodeT2>(dirty)) {
            return ((NodeT2*)mNode[2])->getValueAndCache(ijk, *this);
        }
        return ((NodeT3*)mNode[3])->getValueAndCache(ijk, *this);
    }